

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>_>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>_>_>
         *this)

{
  double *pdVar1;
  bool *pbVar2;
  bool *pbVar3;
  qpTestLog *pqVar4;
  ostringstream *poVar5;
  _Rb_tree_node_base *p_Var6;
  Precision PVar7;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar8;
  Statement *pSVar9;
  ShaderExecutor *pSVar10;
  Variable<tcu::Matrix<float,_2,_4>_> *pVVar11;
  pointer pcVar12;
  double dVar13;
  undefined8 uVar14;
  pointer pMVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  int iVar19;
  uint uVar20;
  _Rb_tree_node_base *p_Var21;
  IVal *pIVar22;
  IVal *pIVar23;
  undefined8 *puVar24;
  Matrix<float,_2,_4> *val;
  string *psVar25;
  Matrix<tcu::Interval,_2,_4> *pMVar26;
  undefined1 *puVar27;
  long lVar28;
  TestLog TVar29;
  long lVar30;
  qpTestLog *pqVar31;
  FloatFormat *pFVar32;
  TestStatus *pTVar33;
  IVal in2;
  IVal in3;
  FloatFormat highpFmt;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>_>_>
  outputs;
  Environment env;
  IVal in0;
  IVal in1;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  ResultCollector status;
  FuncSet funcs;
  ostringstream oss;
  deUint32 in_stack_fffffffffffff958;
  string local_698;
  TestLog *local_670;
  size_t local_668;
  FloatFormat *local_660;
  string local_658;
  ulong local_638;
  long local_630;
  TestStatus *local_628;
  long local_620;
  FloatFormat local_618;
  long local_5f0;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>_>_>
  local_5e8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_5b8;
  undefined1 local_588 [16];
  undefined1 local_578 [8];
  undefined1 auStack_570 [32];
  undefined4 local_550;
  ios_base local_518 [8];
  ios_base local_510 [264];
  undefined1 local_408 [16];
  IVal local_3f8;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_338;
  pointer local_2d8;
  pointer local_2d0;
  pointer local_2c8;
  pointer local_2c0;
  ResultCollector local_2b8;
  undefined1 local_268 [12];
  YesNoMaybe YStack_25c;
  TestLog local_258;
  _Rb_tree_node_base *local_250;
  _Rb_tree_node_base *local_248;
  double local_240;
  undefined1 local_1a8 [376];
  
  this_00 = this->m_samplings;
  pFVar32 = &(this->m_caseCtx).floatFormat;
  PVar7 = (this->m_caseCtx).precision;
  sVar8 = (this->m_caseCtx).numRandoms;
  local_628 = __return_storage_ptr__;
  iVar19 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_660 = pFVar32;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_338,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar32,(FloatFormat *)(ulong)PVar7,(Precision)sVar8,(ulong)(iVar19 + 0xdeadbeef),
             in_stack_fffffffffffff958);
  pMVar15 = local_338.in0.
            super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_668 = (long)local_338.in0.
                    super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_338.in0.
                    super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>_>_>::
  Outputs(&local_5e8,local_668);
  local_618.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_618.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_618.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_618.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_618.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_618.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_618.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_618.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_618._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_5b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_5b8._M_impl.super__Rb_tree_header._M_header;
  local_5b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_5b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_5b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_5b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_5b8._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_2b8);
  local_670 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_2d8 = local_338.in0.
              super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_2d0 = local_338.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_2c8 = local_338.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_2c0 = local_338.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_3f8.m_data.m_data[3].m_data[1].m_lo =
       (double)local_5e8.out0.
               super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  local_3f8.m_data.m_data[3].m_data[1].m_hi =
       (double)local_5e8.out1.
               super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  poVar5 = (ostringstream *)(local_588 + 8);
  local_588._0_8_ = local_670;
  std::__cxx11::ostringstream::ostringstream(poVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar5,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_588,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar5);
  std::ios_base::~ios_base(local_510);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var6 = (_Rb_tree_node_base *)(local_268 + 8);
  local_268._8_4_ = _S_red;
  local_258.m_log = (qpTestLog *)0x0;
  local_240 = 0.0;
  pSVar9 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_250 = p_Var6;
  local_248 = p_Var6;
  (*pSVar9->_vptr_Statement[4])(pSVar9,local_268);
  if (local_250 != p_Var6) {
    p_Var21 = local_250;
    do {
      (**(code **)(**(long **)(p_Var21 + 1) + 0x30))(*(long **)(p_Var21 + 1),local_1a8);
      p_Var21 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var21);
    } while (p_Var21 != p_Var6);
  }
  if (local_240 != 0.0) {
    poVar5 = (ostringstream *)(local_588 + 8);
    local_588._0_8_ = local_670;
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar5,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar5,(char *)local_408._0_8_,local_408._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_588,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((IVal *)local_408._0_8_ != (IVal *)(local_408 + 0x10)) {
      operator_delete((void *)local_408._0_8_,local_3f8.m_data.m_data[0].m_data[0]._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar5);
    std::ios_base::~ios_base(local_510);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_268);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  pSVar10 = (this->m_executor).
            super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
            .m_data.ptr;
  (*pSVar10->_vptr_ShaderExecutor[2])
            (pSVar10,local_668,&local_2d8,&local_3f8.m_data.m_data[3].m_data[1].m_lo,0);
  tcu::Matrix<tcu::Interval,_2,_4>::Matrix((Matrix<tcu::Interval,_2,_4> *)local_588);
  tcu::Matrix<tcu::Interval,_2,_4>::Matrix((Matrix<tcu::Interval,_2,_4> *)local_1a8);
  tcu::Matrix<tcu::Interval,_2,_4>::Matrix((Matrix<tcu::Interval,_2,_4> *)local_268);
  Environment::bind<tcu::Matrix<float,2,4>>
            ((Environment *)&local_5b8,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>.m_ptr,
             (IVal *)local_588);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_5b8,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_408);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_5b8,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_698);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_5b8,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_658);
  Environment::bind<tcu::Matrix<float,2,4>>
            ((Environment *)&local_5b8,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>.m_ptr,
             (IVal *)local_1a8);
  Environment::bind<tcu::Matrix<float,2,4>>
            ((Environment *)&local_5b8,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>.m_ptr,
             (IVal *)local_268);
  if (local_338.in0.
      super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_finish == pMVar15) {
LAB_0090aaed:
    poVar5 = (ostringstream *)(local_588 + 8);
    local_588._0_8_ = local_670;
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"All ",4);
    pTVar33 = local_628;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_588,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar5);
    std::ios_base::~ios_base(local_510);
    local_588._0_8_ = (TestLog *)local_578;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"Pass","");
    pTVar33->m_code = QP_TEST_RESULT_PASS;
    (pTVar33->m_description)._M_dataplus._M_p = (pointer)&(pTVar33->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar33->m_description,local_588._0_8_,
               (pointer)(local_588._0_8_ + CONCAT44(local_588._12_4_,local_588._8_4_)));
    if ((TestLog *)local_588._0_8_ == (TestLog *)local_578) goto LAB_0090acd5;
    TVar29.m_log = (qpTestLog *)CONCAT44(local_578._4_4_,local_578._0_4_);
    local_268._0_8_ = local_588._0_8_;
  }
  else {
    local_5f0 = local_668 + (local_668 == 0);
    local_620 = 0;
    local_630 = 0;
    local_638 = 0;
    pFVar32 = local_660;
    do {
      tcu::Matrix<tcu::Interval,_2,_4>::Matrix((Matrix<tcu::Interval,_2,_4> *)local_1a8);
      tcu::Matrix<tcu::Interval,_2,_4>::Matrix((Matrix<tcu::Interval,_2,_4> *)local_268);
      local_698.field_2._M_allocated_capacity = 0;
      local_698.field_2._8_8_ = 0;
      local_698._M_dataplus._M_p = (char *)0x0;
      local_698._M_string_length = 0;
      lVar28 = 0;
      psVar25 = &local_698;
      bVar16 = true;
      do {
        bVar18 = bVar16;
        lVar30 = 0;
        do {
          *(undefined4 *)&(&psVar25->_M_dataplus)[lVar30]._M_p =
               *(undefined4 *)
                ((long)((local_338.in0.
                         super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[lVar30].m_data +
                lVar28 * 4 + local_620);
          lVar30 = lVar30 + 1;
        } while (lVar30 != 4);
        lVar28 = 1;
        psVar25 = (string *)((long)&local_698._M_dataplus._M_p + 4);
        bVar16 = false;
      } while (bVar18);
      ContainerTraits<tcu::Matrix<float,_2,_4>,_tcu::Matrix<tcu::Interval,_2,_4>_>::doRound
                ((IVal *)local_408,pFVar32,(Matrix<float,_2,_4> *)&local_698);
      ContainerTraits<tcu::Matrix<float,_2,_4>,_tcu::Matrix<tcu::Interval,_2,_4>_>::doConvert
                ((IVal *)local_588,pFVar32,(IVal *)local_408);
      pIVar22 = Environment::lookup<tcu::Matrix<float,2,4>>
                          ((Environment *)&local_5b8,
                           (this->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>
                           .m_ptr);
      lVar28 = 0;
      pIVar23 = (IVal *)local_588;
      bVar16 = true;
      do {
        bVar18 = bVar16;
        lVar30 = 0;
        do {
          *(undefined8 *)((long)&(pIVar22->m_data).m_data[0].m_data[lVar28].m_hi + lVar30) =
               *(undefined8 *)((long)&(pIVar23->m_data).m_data[0].m_data[0].m_hi + lVar30);
          pbVar2 = &(pIVar23->m_data).m_data[0].m_data[0].m_hasNaN + lVar30;
          dVar13 = *(double *)(pbVar2 + 8);
          pbVar3 = &(pIVar22->m_data).m_data[0].m_data[lVar28].m_hasNaN + lVar30;
          *(undefined8 *)pbVar3 = *(undefined8 *)pbVar2;
          *(double *)(pbVar3 + 8) = dVar13;
          lVar30 = lVar30 + 0x30;
        } while (lVar30 != 0xc0);
        lVar28 = 1;
        pIVar23 = (IVal *)auStack_570;
        bVar16 = false;
      } while (bVar18);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_5b8,
                 (this->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_5b8,
                 (this->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_5b8,
                 (this->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      auStack_570._16_4_ = (this->m_caseCtx).precision;
      auStack_570._8_8_ = pFVar32->m_maxValue;
      local_588._0_8_ = *(undefined8 *)pFVar32;
      local_588._8_4_ = pFVar32->m_fractionBits;
      local_588._12_4_ = pFVar32->m_hasSubnormal;
      local_578._0_4_ = pFVar32->m_hasInf;
      local_578._4_4_ = pFVar32->m_hasNaN;
      auStack_570[0] = pFVar32->m_exactPrecision;
      auStack_570._1_3_ = *(undefined3 *)&pFVar32->field_0x19;
      auStack_570._4_4_ = *(undefined4 *)&pFVar32->field_0x1c;
      local_550 = 0;
      pSVar9 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      auStack_570._24_8_ = &local_5b8;
      (*pSVar9->_vptr_Statement[3])(pSVar9,(IVal *)local_588);
      pIVar23 = Environment::lookup<tcu::Matrix<float,2,4>>
                          ((Environment *)&local_5b8,
                           (this->m_variables).out1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_2,_4>,_tcu::Matrix<tcu::Interval,_2,_4>_>::doConvert
                ((IVal *)local_588,&local_618,pIVar23);
      lVar28 = local_630;
      pMVar26 = (Matrix<tcu::Interval,_2,_4> *)local_268;
      pIVar23 = (IVal *)local_588;
      bVar16 = true;
      do {
        bVar18 = bVar16;
        lVar30 = 0;
        do {
          *(undefined8 *)((long)&(pMVar26->m_data).m_data[0].m_data[0].m_hi + lVar30) =
               *(undefined8 *)((long)&(pIVar23->m_data).m_data[0].m_data[0].m_hi + lVar30);
          pbVar2 = &(pIVar23->m_data).m_data[0].m_data[0].m_hasNaN + lVar30;
          dVar13 = *(double *)(pbVar2 + 8);
          pbVar3 = &(pMVar26->m_data).m_data[0].m_data[0].m_hasNaN + lVar30;
          *(undefined8 *)pbVar3 = *(undefined8 *)pbVar2;
          *(double *)(pbVar3 + 8) = dVar13;
          lVar30 = lVar30 + 0x30;
        } while (lVar30 != 0xc0);
        pMVar26 = (Matrix<tcu::Interval,_2,_4> *)&local_250;
        pIVar23 = (IVal *)auStack_570;
        bVar16 = false;
      } while (bVar18);
      bVar16 = contains<tcu::Matrix<float,2,4>>
                         ((Matrix<tcu::Interval,_2,_4> *)local_268,
                          local_5e8.out1.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + local_630);
      local_588._0_8_ = local_578;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_588,"Shader output 1 is outside acceptable range","");
      bVar16 = tcu::ResultCollector::check(&local_2b8,bVar16,(string *)local_588);
      if ((TestLog *)local_588._0_8_ != (TestLog *)local_578) {
        operator_delete((void *)local_588._0_8_,CONCAT44(local_578._4_4_,local_578._0_4_) + 1);
      }
      pIVar23 = Environment::lookup<tcu::Matrix<float,2,4>>
                          ((Environment *)&local_5b8,
                           (this->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_2,_4>,_tcu::Matrix<tcu::Interval,_2,_4>_>::doConvert
                ((IVal *)local_588,&local_618,pIVar23);
      puVar27 = local_1a8;
      psVar25 = (string *)local_588;
      bVar18 = true;
      do {
        bVar17 = bVar18;
        lVar30 = 0;
        do {
          *(undefined8 *)(puVar27 + lVar30 + 0x10) =
               *(undefined8 *)((long)&psVar25->field_2 + lVar30);
          puVar24 = (undefined8 *)((long)&(psVar25->_M_dataplus)._M_p + lVar30);
          uVar14 = puVar24[1];
          *(undefined8 *)(puVar27 + lVar30) = *puVar24;
          *(undefined8 *)((long)(puVar27 + lVar30) + 8) = uVar14;
          lVar30 = lVar30 + 0x30;
        } while (lVar30 != 0xc0);
        puVar27 = local_1a8 + 0x18;
        psVar25 = (string *)auStack_570;
        bVar18 = false;
      } while (bVar17);
      bVar18 = contains<tcu::Matrix<float,2,4>>
                         ((IVal *)local_1a8,
                          local_5e8.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar28);
      local_588._0_8_ = local_578;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_588,"Shader output 0 is outside acceptable range","");
      bVar18 = tcu::ResultCollector::check(&local_2b8,bVar18,(string *)local_588);
      if ((TestLog *)local_588._0_8_ != (TestLog *)local_578) {
        operator_delete((void *)local_588._0_8_,CONCAT44(local_578._4_4_,local_578._0_4_) + 1);
      }
      pFVar32 = local_660;
      if (!bVar16 || !bVar18) {
        uVar20 = (int)local_638 + 1;
        local_638 = (ulong)uVar20;
        poVar5 = (ostringstream *)(local_588 + 8);
        if ((int)uVar20 < 0x65) {
          local_588._0_8_ = local_670;
          std::__cxx11::ostringstream::ostringstream(poVar5);
          pFVar32 = local_660;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," sample:\n",9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\t",1);
          pVVar11 = (this->m_variables).in0.
                    super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>
                    .m_ptr;
          val = (Matrix<float,_2,_4> *)(local_408 + 0x10);
          pcVar12 = (pVVar11->m_name)._M_dataplus._M_p;
          local_408._0_8_ = val;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_408,pcVar12,pcVar12 + (pVVar11->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar5,(char *)local_408._0_8_,local_408._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," = ",3);
          valueToString<tcu::Matrix<float,2,4>>
                    (&local_698,(shaderexecutor *)&local_618,
                     (FloatFormat *)
                     (local_338.in0.
                      super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar28),val);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar5,local_698._M_dataplus._M_p,local_698._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_698._M_dataplus._M_p != &local_698.field_2) {
            operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
          }
          if ((Matrix<float,_2,_4> *)local_408._0_8_ != (Matrix<float,_2,_4> *)(local_408 + 0x10)) {
            operator_delete((void *)local_408._0_8_,local_3f8.m_data.m_data[0].m_data[0]._0_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\t",1);
          pVVar11 = (this->m_variables).out0.
                    super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>
                    .m_ptr;
          pIVar23 = (IVal *)(local_408 + 0x10);
          pcVar12 = (pVVar11->m_name)._M_dataplus._M_p;
          local_408._0_8_ = pIVar23;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_408,pcVar12,pcVar12 + (pVVar11->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar5,(char *)local_408._0_8_,local_408._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," = ",3);
          valueToString<tcu::Matrix<float,2,4>>
                    (&local_698,(shaderexecutor *)&local_618,
                     (FloatFormat *)
                     (local_5e8.out0.
                      super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar28),
                     (Matrix<float,_2,_4> *)pIVar23);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar5,local_698._M_dataplus._M_p,local_698._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar5,"\tExpected range: ",0x11);
          intervalToString<tcu::Matrix<float,2,4>>
                    (&local_658,(shaderexecutor *)&local_618,(FloatFormat *)local_1a8,pIVar23);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar5,local_658._M_dataplus._M_p,local_658._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_658._M_dataplus._M_p != &local_658.field_2) {
            operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_698._M_dataplus._M_p != &local_698.field_2) {
            operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
          }
          if ((IVal *)local_408._0_8_ != (IVal *)(local_408 + 0x10)) {
            operator_delete((void *)local_408._0_8_,local_3f8.m_data.m_data[0].m_data[0]._0_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\t",1);
          pVVar11 = (this->m_variables).out1.
                    super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>
                    .m_ptr;
          pIVar23 = (IVal *)(local_408 + 0x10);
          pcVar12 = (pVVar11->m_name)._M_dataplus._M_p;
          local_408._0_8_ = pIVar23;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_408,pcVar12,pcVar12 + (pVVar11->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar5,(char *)local_408._0_8_,local_408._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," = ",3);
          valueToString<tcu::Matrix<float,2,4>>
                    (&local_698,(shaderexecutor *)&local_618,
                     (FloatFormat *)
                     (local_5e8.out1.
                      super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar28),
                     (Matrix<float,_2,_4> *)pIVar23);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar5,local_698._M_dataplus._M_p,local_698._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar5,"\tExpected range: ",0x11);
          intervalToString<tcu::Matrix<float,2,4>>
                    (&local_658,(shaderexecutor *)&local_618,(FloatFormat *)local_268,pIVar23);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar5,local_658._M_dataplus._M_p,local_658._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_658._M_dataplus._M_p != &local_658.field_2) {
            operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_698._M_dataplus._M_p != &local_698.field_2) {
            operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
          }
          if ((IVal *)local_408._0_8_ != (IVal *)(local_408 + 0x10)) {
            operator_delete((void *)local_408._0_8_,local_3f8.m_data.m_data[0].m_data[0]._0_8_ + 1);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_588,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar5);
          std::ios_base::~ios_base(local_510);
        }
      }
      local_630 = local_630 + 1;
      local_620 = local_620 + 0x20;
    } while (local_630 != local_5f0);
    iVar19 = (int)local_638;
    if (iVar19 < 0x65) {
      if (iVar19 == 0) goto LAB_0090aaed;
    }
    else {
      poVar5 = (ostringstream *)(local_588 + 8);
      local_588._0_8_ = local_670;
      std::__cxx11::ostringstream::ostringstream(poVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"(Skipped ",9);
      std::ostream::operator<<(poVar5,iVar19 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_588,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar5);
      std::ios_base::~ios_base(local_510);
    }
    poVar5 = (ostringstream *)(local_588 + 8);
    local_588._0_8_ = local_670;
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::ostream::operator<<(poVar5,iVar19);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_588,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar5);
    std::ios_base::~ios_base(local_510);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_588);
    std::ostream::operator<<(local_588,iVar19);
    pTVar33 = local_628;
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_588);
    std::ios_base::~ios_base(local_518);
    local_588._0_8_ = local_578;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_588," test failed. Check log for the details","");
    pqVar4 = (qpTestLog *)
             (CONCAT44(local_588._12_4_,local_588._8_4_) + CONCAT44(YStack_25c,local_268._8_4_));
    TVar29.m_log = (qpTestLog *)0xf;
    if ((TestLog *)local_268._0_8_ != &local_258) {
      TVar29.m_log = local_258.m_log;
    }
    if (TVar29.m_log < pqVar4) {
      pqVar31 = (qpTestLog *)0xf;
      if ((TestLog *)local_588._0_8_ != (TestLog *)local_578) {
        pqVar31 = (qpTestLog *)CONCAT44(local_578._4_4_,local_578._0_4_);
      }
      if (pqVar31 < pqVar4) goto LAB_0090aadb;
      puVar24 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_588,0,(char *)0x0,local_268._0_8_);
    }
    else {
LAB_0090aadb:
      puVar24 = (undefined8 *)std::__cxx11::string::_M_append(local_268,local_588._0_8_);
    }
    local_1a8._0_8_ = local_1a8 + 0x10;
    pdVar1 = (double *)(puVar24 + 2);
    if ((double *)*puVar24 == pdVar1) {
      local_1a8._16_8_ = *pdVar1;
      local_1a8._24_4_ = *(undefined4 *)(puVar24 + 3);
      local_1a8._28_4_ = *(undefined4 *)((long)puVar24 + 0x1c);
    }
    else {
      local_1a8._16_8_ = *pdVar1;
      local_1a8._0_8_ = (double *)*puVar24;
    }
    local_1a8._8_8_ = puVar24[1];
    *puVar24 = pdVar1;
    puVar24[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    pTVar33->m_code = QP_TEST_RESULT_FAIL;
    (pTVar33->m_description)._M_dataplus._M_p = (pointer)&(pTVar33->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar33->m_description,local_1a8._0_8_,
               (undefined1 *)(local_1a8._8_8_ + local_1a8._0_8_));
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((TestLog *)local_588._0_8_ != (TestLog *)local_578) {
      operator_delete((void *)local_588._0_8_,CONCAT44(local_578._4_4_,local_578._0_4_) + 1);
    }
    TVar29.m_log = local_258.m_log;
    if ((TestLog *)local_268._0_8_ == &local_258) goto LAB_0090acd5;
  }
  operator_delete((void *)local_268._0_8_,(ulong)((long)&(TVar29.m_log)->flags + 1));
LAB_0090acd5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8.m_message._M_dataplus._M_p != &local_2b8.m_message.field_2) {
    operator_delete(local_2b8.m_message._M_dataplus._M_p,
                    local_2b8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8.m_prefix._M_dataplus._M_p != &local_2b8.m_prefix.field_2) {
    operator_delete(local_2b8.m_prefix._M_dataplus._M_p,
                    local_2b8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_5b8);
  if (local_5e8.out1.
      super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5e8.out1.
                    super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_5e8.out1.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_5e8.out1.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_5e8.out0.
      super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5e8.out0.
                    super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_5e8.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_5e8.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_338.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_338.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_338.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_338.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_338.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_338.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_338.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_338.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_338.in1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_338.in1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_338.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_338.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_338.in0.
      super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_338.in0.
                    super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_338.in0.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_338.in0.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar33;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}